

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::array<char,2ul>>::emplace_back<std::array<char,2ul>const&>
          (SmallVectorBase<std::array<char,2ul>> *this,array<char,_2UL> *args)

{
  long lVar1;
  ulong uVar2;
  SmallVectorBase<std::array<char,2ul>> *__src;
  void *__dest;
  reference paVar3;
  SmallVectorBase<std::array<char,2ul>> *__src_00;
  ulong uVar4;
  
  __src_00 = (SmallVectorBase<std::array<char,2ul>> *)(*(long *)(this + 8) * 2 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    *(undefined2 *)__src_00 = *(undefined2 *)args->_M_elems;
    lVar1 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar1 + 1;
    return (reference)(*(long *)this + lVar1 * 2);
  }
  if (*(long *)(this + 8) != 0x3fffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0x3fffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0x3fffffffffffffff;
    }
    lVar1 = *(long *)this;
    __dest = operator_new(uVar4 * 2);
    paVar3 = (reference)((long)__dest + ((long)__src_00 - lVar1));
    *(undefined2 *)((long)__dest + ((long)__src_00 - lVar1)) = *(undefined2 *)args->_M_elems;
    __src = *(SmallVectorBase<std::array<char,2ul>> **)this;
    lVar1 = *(long *)(this + 8);
    if (__src + (lVar1 * 2 - (long)__src_00) == (SmallVectorBase<std::array<char,2ul>> *)0x0) {
      if (lVar1 != 0) {
        memmove(__dest,__src,lVar1 * 2);
      }
    }
    else {
      if (__src != __src_00) {
        memmove(__dest,__src,(long)__src_00 - (long)__src);
      }
      memcpy(paVar3 + 1,__src_00,(size_t)(__src + (lVar1 * 2 - (long)__src_00)));
    }
    if (__src != this + 0x18) {
      operator_delete(__src);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return paVar3;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }